

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O2

matd_t * homography_compute2(double (*c) [4])

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  matd_t *pmVar4;
  int row;
  uint uVar5;
  ulong uVar6;
  int i;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 uVar14;
  double sum;
  undefined4 uVar15;
  double dVar16;
  double local_2b8 [72];
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  undefined8 local_38;
  
  pdVar10 = local_2b8;
  local_2b8[2] = 1.0;
  local_2b8[5] = 0.0;
  local_2b8[3] = 0.0;
  local_2b8[4] = 0.0;
  local_2b8[8] = (*c)[2];
  local_2b8[0] = (*c)[0];
  local_2b8[1] = (*c)[1];
  local_2b8[6] = local_2b8[8] * -local_2b8[0];
  local_2b8[7] = local_2b8[8] * -local_2b8[1];
  local_2b8[0xb] = 0.0;
  local_2b8[9] = 0.0;
  local_2b8[10] = 0.0;
  local_2b8[0xc] = local_2b8[0];
  local_2b8[0xd] = local_2b8[1];
  local_2b8[0xe] = 1.0;
  local_2b8[0x11] = (*c)[3];
  local_2b8[0xf] = local_2b8[0x11] * -local_2b8[0];
  local_2b8[0x10] = local_2b8[0x11] * -local_2b8[1];
  local_2b8[0x14] = 1.0;
  local_2b8[0x15] = 0.0;
  local_2b8[0x16] = 0.0;
  local_2b8[0x17] = 0.0;
  local_2b8[0x1a] = c[1][2];
  local_2b8[0x12] = c[1][0];
  local_2b8[0x13] = c[1][1];
  local_2b8[0x18] = local_2b8[0x1a] * -local_2b8[0x12];
  local_2b8[0x19] = local_2b8[0x1a] * -local_2b8[0x13];
  local_2b8[0x1d] = 0.0;
  local_2b8[0x1b] = 0.0;
  local_2b8[0x1c] = 0.0;
  local_2b8[0x1e] = local_2b8[0x12];
  local_2b8[0x1f] = local_2b8[0x13];
  local_2b8[0x20] = 1.0;
  local_2b8[0x23] = c[1][3];
  local_2b8[0x21] = local_2b8[0x23] * -local_2b8[0x12];
  local_2b8[0x22] = local_2b8[0x23] * -local_2b8[0x13];
  local_2b8[0x26] = 1.0;
  local_2b8[0x27] = 0.0;
  local_2b8[0x28] = 0.0;
  local_2b8[0x29] = 0.0;
  local_2b8[0x2c] = c[2][2];
  local_2b8[0x24] = c[2][0];
  local_2b8[0x25] = c[2][1];
  local_2b8[0x2a] = local_2b8[0x2c] * -local_2b8[0x24];
  local_2b8[0x2b] = local_2b8[0x2c] * -local_2b8[0x25];
  local_2b8[0x2f] = 0.0;
  local_2b8[0x2d] = 0.0;
  local_2b8[0x2e] = 0.0;
  local_2b8[0x30] = local_2b8[0x24];
  local_2b8[0x31] = local_2b8[0x25];
  local_2b8[0x32] = 1.0;
  local_2b8[0x35] = c[2][3];
  local_2b8[0x33] = local_2b8[0x35] * -local_2b8[0x24];
  local_2b8[0x34] = local_2b8[0x35] * -local_2b8[0x25];
  local_2b8[0x38] = 1.0;
  local_2b8[0x39] = 0.0;
  local_2b8[0x3a] = 0.0;
  local_2b8[0x3b] = 0.0;
  local_2b8[0x3e] = c[3][2];
  local_2b8[0x36] = c[3][0];
  local_2b8[0x37] = c[3][1];
  local_2b8[0x3c] = local_2b8[0x3e] * -local_2b8[0x36];
  local_2b8[0x3d] = local_2b8[0x3e] * -local_2b8[0x37];
  local_2b8[0x41] = 0.0;
  local_2b8[0x3f] = 0.0;
  local_2b8[0x40] = 0.0;
  local_2b8[0x42] = local_2b8[0x36];
  local_2b8[0x43] = local_2b8[0x37];
  local_2b8[0x44] = 1.0;
  local_2b8[0x47] = c[3][3];
  local_2b8[0x45] = local_2b8[0x47] * -local_2b8[0x36];
  local_2b8[0x46] = local_2b8[0x47] * -local_2b8[0x37];
  pdVar7 = local_2b8;
  pdVar11 = pdVar10;
  uVar13 = 1;
  for (uVar12 = 0; pdVar7 = pdVar7 + 10, uVar12 != 8; uVar12 = uVar12 + 1) {
    uVar14 = 0;
    uVar15 = 0;
    uVar9 = 0xffffffff;
    pdVar3 = pdVar11;
    for (uVar6 = uVar12; uVar6 != 8; uVar6 = uVar6 + 1) {
      dVar16 = ABS(*pdVar3);
      if ((double)CONCAT44(uVar15,uVar14) <= dVar16 && dVar16 != (double)CONCAT44(uVar15,uVar14)) {
        uVar9 = uVar6 & 0xffffffff;
      }
      if (dVar16 <= (double)CONCAT44(uVar15,uVar14)) {
        dVar16 = (double)CONCAT44(uVar15,uVar14);
      }
      pdVar3 = pdVar3 + 9;
      uVar14 = SUB84(dVar16,0);
      uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
    }
    if ((double)CONCAT44(uVar15,uVar14) <= 1e-10 && (double)CONCAT44(uVar15,uVar14) != 1e-10) {
      fwrite("WRN: Matrix is singular.\n",0x19,1,_stderr);
    }
    pdVar3 = pdVar7;
    uVar6 = uVar13;
    if (uVar12 != uVar9) {
      for (lVar8 = 0; uVar12 + lVar8 != 9; lVar8 = lVar8 + 1) {
        dVar16 = pdVar11[lVar8];
        pdVar11[lVar8] = pdVar10[(int)uVar9 * 9 + lVar8];
        pdVar10[(int)uVar9 * 9 + lVar8] = dVar16;
      }
    }
    for (; uVar6 < 8; uVar6 = uVar6 + 1) {
      lVar8 = uVar6 * 9 + uVar12;
      dVar16 = local_2b8[lVar8];
      dVar1 = local_2b8[uVar12 * 10];
      local_2b8[lVar8] = 0.0;
      for (uVar9 = 1; uVar12 + uVar9 != 9; uVar9 = uVar9 + 1) {
        pdVar3[uVar9 - 1] = pdVar11[uVar9] * (-dVar16 / dVar1) + pdVar3[uVar9 - 1];
      }
      pdVar3 = pdVar3 + 9;
    }
    uVar13 = uVar13 + 1;
    pdVar11 = pdVar11 + 10;
    pdVar10 = pdVar10 + 1;
  }
  uVar5 = 0x3f;
  for (uVar2 = 7; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar13 = (ulong)uVar2;
    pdVar10 = local_2b8 + uVar13 * 9 + 0x11;
    dVar16 = 0.0;
    while (uVar13 = uVar13 + 1, uVar13 != 8) {
      dVar16 = dVar16 + local_2b8[uVar5 + uVar13] * *pdVar10;
      pdVar10 = pdVar10 + 9;
    }
    local_2b8[(ulong)(uVar2 * 9) + 8] =
         (local_2b8[(ulong)(uVar2 * 9) + 8] - dVar16) / local_2b8[uVar2 * 10];
    uVar5 = uVar5 - 9;
  }
  local_78 = local_2b8[8];
  local_70 = local_2b8[0x11];
  local_68 = local_2b8[0x1a];
  local_60 = local_2b8[0x23];
  local_58 = local_2b8[0x2c];
  local_50 = local_2b8[0x35];
  local_48 = local_2b8[0x3e];
  local_40 = local_2b8[0x47];
  local_38 = 0x3ff0000000000000;
  pmVar4 = matd_create_data(3,3,&local_78);
  return pmVar4;
}

Assistant:

matd_t* homography_compute2(double c[4][4]) {
    double A[] =  {
            c[0][0], c[0][1], 1,       0,       0, 0, -c[0][0]*c[0][2], -c[0][1]*c[0][2], c[0][2],
                  0,       0, 0, c[0][0], c[0][1], 1, -c[0][0]*c[0][3], -c[0][1]*c[0][3], c[0][3],
            c[1][0], c[1][1], 1,       0,       0, 0, -c[1][0]*c[1][2], -c[1][1]*c[1][2], c[1][2],
                  0,       0, 0, c[1][0], c[1][1], 1, -c[1][0]*c[1][3], -c[1][1]*c[1][3], c[1][3],
            c[2][0], c[2][1], 1,       0,       0, 0, -c[2][0]*c[2][2], -c[2][1]*c[2][2], c[2][2],
                  0,       0, 0, c[2][0], c[2][1], 1, -c[2][0]*c[2][3], -c[2][1]*c[2][3], c[2][3],
            c[3][0], c[3][1], 1,       0,       0, 0, -c[3][0]*c[3][2], -c[3][1]*c[3][2], c[3][2],
                  0,       0, 0, c[3][0], c[3][1], 1, -c[3][0]*c[3][3], -c[3][1]*c[3][3], c[3][3],
    };

    double epsilon = 1e-10;

    // Eliminate.
    for (int col = 0; col < 8; col++) {
        // Find best row to swap with.
        double max_val = 0;
        int max_val_idx = -1;
        for (int row = col; row < 8; row++) {
            double val = fabs(A[row*9 + col]);
            if (val > max_val) {
                max_val = val;
                max_val_idx = row;
            }
        }

        if (max_val < epsilon) {
            fprintf(stderr, "WRN: Matrix is singular.\n");
        }

        // Swap to get best row.
        if (max_val_idx != col) {
            for (int i = col; i < 9; i++) {
                double tmp = A[col*9 + i];
                A[col*9 + i] = A[max_val_idx*9 + i];
                A[max_val_idx*9 + i] = tmp;
            }
        }

        // Do eliminate.
        for (int i = col + 1; i < 8; i++) {
            double f = A[i*9 + col]/A[col*9 + col];
            A[i*9 + col] = 0;
            for (int j = col + 1; j < 9; j++) {
                A[i*9 + j] -= f*A[col*9 + j];
            }
        }
    }

    // Back solve.
    for (int col = 7; col >=0; col--) {
        double sum = 0;
        for (int i = col + 1; i < 8; i++) {
            sum += A[col*9 + i]*A[i*9 + 8];
        }
        A[col*9 + 8] = (A[col*9 + 8] - sum)/A[col*9 + col];
    }
    return matd_create_data(3, 3, (double[]) { A[8], A[17], A[26], A[35], A[44], A[53], A[62], A[71], 1 });
}